

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O0

void archive_entry_sparse_clear(archive_entry *entry)

{
  ae_sparse *paVar1;
  ae_sparse *sp;
  archive_entry *entry_local;
  
  while (entry->sparse_head != (ae_sparse *)0x0) {
    paVar1 = entry->sparse_head->next;
    free(entry->sparse_head);
    entry->sparse_head = paVar1;
  }
  entry->sparse_tail = (ae_sparse *)0x0;
  return;
}

Assistant:

void
archive_entry_sparse_clear(struct archive_entry *entry)
{
	struct ae_sparse *sp;

	while (entry->sparse_head != NULL) {
		sp = entry->sparse_head->next;
		free(entry->sparse_head);
		entry->sparse_head = sp;
	}
	entry->sparse_tail = NULL;
}